

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int readMasterJournal(sqlite3_file *pJrnl,char *zMaster,u32 nMaster)

{
  int iVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  i64 szJ;
  uchar aMagic [8];
  long local_48;
  u32 local_40;
  uint local_3c;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *zMaster = '\0';
  iVar1 = (*pJrnl->pMethods->xFileSize)(pJrnl,&local_48);
  if ((0xf < local_48 && iVar1 == 0) &&
     (iVar1 = read32bits(pJrnl,local_48 + -0x10,&local_3c), iVar1 == 0)) {
    iVar1 = 0;
    if (((local_3c != 0 && local_3c < nMaster) &&
        (((iVar1 = read32bits(pJrnl,local_48 + -0xc,&local_40), iVar1 == 0 &&
          (iVar1 = (*pJrnl->pMethods->xRead)(pJrnl,&local_38,8,local_48 + -8), iVar1 == 0)) &&
         (iVar1 = 0, local_38 == -0x289c5edf06fa2a27)))) &&
       (iVar1 = (*pJrnl->pMethods->xRead)
                          (pJrnl,zMaster,local_3c,(local_48 - (ulong)local_3c) + -0x10), iVar1 == 0)
       ) {
      uVar2 = 0;
      do {
        local_40 = local_40 - (int)zMaster[uVar2];
        uVar2 = uVar2 + 1;
      } while (local_3c != uVar2);
      iVar1 = 0;
      if (local_40 != 0) {
        local_3c = 0;
      }
      zMaster[local_3c] = '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int readMasterJournal(sqlite3_file *pJrnl, char *zMaster, u32 nMaster){
  int rc;                    /* Return code */
  u32 len;                   /* Length in bytes of master journal name */
  i64 szJ;                   /* Total size in bytes of journal file pJrnl */
  u32 cksum;                 /* MJ checksum value read from journal */
  u32 u;                     /* Unsigned loop counter */
  unsigned char aMagic[8];   /* A buffer to hold the magic header */
  zMaster[0] = '\0';

  if( SQLITE_OK!=(rc = sqlite3OsFileSize(pJrnl, &szJ))
   || szJ<16
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-16, &len))
   || len>=nMaster 
   || len==0 
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-12, &cksum))
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, aMagic, 8, szJ-8))
   || memcmp(aMagic, aJournalMagic, 8)
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, zMaster, len, szJ-16-len))
  ){
    return rc;
  }

  /* See if the checksum matches the master journal name */
  for(u=0; u<len; u++){
    cksum -= zMaster[u];
  }
  if( cksum ){
    /* If the checksum doesn't add up, then one or more of the disk sectors
    ** containing the master journal filename is corrupted. This means
    ** definitely roll back, so just return SQLITE_OK and report a (nul)
    ** master-journal filename.
    */
    len = 0;
  }
  zMaster[len] = '\0';
   
  return SQLITE_OK;
}